

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_setundo(_glist *x,t_undofn undofn,void *buf,char *name)

{
  bool bVar1;
  int iVar2;
  int hadone;
  char *name_local;
  void *buf_local;
  t_undofn undofn_local;
  _glist *x_local;
  
  bVar1 = false;
  if (((*(long *)((pd_maininstance.pd_gui)->i_editor + 0x18) != 0) &&
      (*(long *)((pd_maininstance.pd_gui)->i_editor + 0x28) != 0)) &&
     (buf != *(void **)((pd_maininstance.pd_gui)->i_editor + 0x28))) {
    (**(code **)((pd_maininstance.pd_gui)->i_editor + 0x18))
              (*(undefined8 *)((pd_maininstance.pd_gui)->i_editor + 0x30),
               *(undefined8 *)((pd_maininstance.pd_gui)->i_editor + 0x28),0);
    bVar1 = true;
  }
  *(_glist **)((pd_maininstance.pd_gui)->i_editor + 0x30) = x;
  *(t_undofn *)((pd_maininstance.pd_gui)->i_editor + 0x18) = undofn;
  *(void **)((pd_maininstance.pd_gui)->i_editor + 0x28) = buf;
  *(undefined4 *)((pd_maininstance.pd_gui)->i_editor + 0x20) = 1;
  *(char **)((pd_maininstance.pd_gui)->i_editor + 0x38) = name;
  if (((x == (_glist *)0x0) || (iVar2 = glist_isvisible(x), iVar2 == 0)) ||
     (iVar2 = glist_istoplevel(x), iVar2 == 0)) {
    if (bVar1) {
      pdgui_vmess("pdtk_undomenu","rss","nobody","no");
    }
  }
  else {
    pdgui_vmess("pdtk_undomenu","^ss",x,name,"no");
  }
  return;
}

Assistant:

void canvas_setundo(t_canvas *x, t_undofn undofn, void *buf,
    const char *name)
{
    int hadone = 0;
        /* blow away the old undo information.  In one special case the
           old undo info is re-used; if so we shouldn't free it here. */
    if (EDITOR->canvas_undo_fn && EDITOR->canvas_undo_buf && (buf != EDITOR->canvas_undo_buf))
    {
        (*EDITOR->canvas_undo_fn)(EDITOR->canvas_undo_canvas, EDITOR->canvas_undo_buf, UNDO_FREE);
        hadone = 1;
    }
    EDITOR->canvas_undo_canvas = x;
    EDITOR->canvas_undo_fn = undofn;
    EDITOR->canvas_undo_buf = buf;
    EDITOR->canvas_undo_whatnext = UNDO_UNDO;
    EDITOR->canvas_undo_name = name;
    if (x && glist_isvisible(x) && glist_istoplevel(x))
            /* enable undo in menu */
        pdgui_vmess("pdtk_undomenu", "^ss", x, name, "no");
    else if (hadone)
        pdgui_vmess("pdtk_undomenu", "rss", "nobody", "no", "no");
}